

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorRotationSpeed.cpp
# Opt level: O3

void __thiscall
chrono::ChLinkMotorRotationSpeed::ChLinkMotorRotationSpeed(ChLinkMotorRotationSpeed *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  ChFunction *__tmp;
  
  ChLinkMotorRotation::ChLinkMotorRotation(&this->super_ChLinkMotorRotation);
  *(undefined ***)
   &(this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.super_ChLinkMate.
    super_ChLink.super_ChLinkBase.super_ChPhysicsItem = &PTR__ChLinkMotorRotationSpeed_00b1e780;
  ChVariablesGeneric::ChVariablesGeneric(&this->variable,1);
  if ((((0 < (this->variable).Mmass.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
             .m_storage.m_rows) &&
       (0 < (this->variable).Mmass.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
            m_storage.m_cols)) &&
      (*(this->variable).Mmass.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
        m_storage.m_data = 1.0,
      0 < (this->variable).inv_Mmass.
          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows)) &&
     (0 < (this->variable).inv_Mmass.
          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols)) {
    *(this->variable).inv_Mmass.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
     m_storage.m_data = 1.0;
    p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x20);
    p_Var1->_M_use_count = 1;
    p_Var1->_M_weak_count = 1;
    p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b03ad8;
    p_Var1[1]._vptr__Sp_counted_base = (_func_int **)&PTR__ChFunction_00b443a0;
    p_Var1[1]._M_use_count = 0;
    p_Var1[1]._M_weak_count = 0x3ff00000;
    (this->super_ChLinkMotorRotation).super_ChLinkMotor.m_func.
    super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)(p_Var1 + 1);
    this_00 = (this->super_ChLinkMotorRotation).super_ChLinkMotor.m_func.
              super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (this->super_ChLinkMotorRotation).super_ChLinkMotor.m_func.
    super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var1;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    *(undefined8 *)&(this->super_ChLinkMotorRotation).field_0x278 = 0;
    this->aux_dt = 0.0;
    this->aux_dtdt = 0.0;
    this->avoid_angle_drift = true;
    return;
  }
  __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1, 1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1, 1>, Level = 1]"
               );
}

Assistant:

ChLinkMotorRotationSpeed::ChLinkMotorRotationSpeed() {
    variable.GetMass()(0, 0) = 1.0;
    variable.GetInvMass()(0, 0) = 1.0;

    m_func = chrono_types::make_shared<ChFunction_Const>(1.0);

    rot_offset = 0;

    aux_dt = 0;  // used for integrating speed, = rot
    aux_dtdt = 0;

    avoid_angle_drift = true;
}